

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

void UpdateW(fixed_y_t *src,fixed_y_t *dst,int w,int rgb_bit_depth,
            SharpYuvTransferFunctionType transfer_type)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t v;
  uint32_t uVar3;
  uint32_t uVar4;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  uint32_t Y;
  uint32_t B;
  uint32_t G;
  uint32_t R;
  int i;
  int bit_depth;
  SharpYuvTransferFunctionType in_stack_ffffffffffffffd8;
  
  iVar2 = GetPrecisionShift(in_ECX);
  v = in_ECX + iVar2;
  iVar2 = 0;
  do {
    in_stack_ffffffffffffffd8 =
         SharpYuvGammaToLinear((uint16_t)(v >> 0x10),iVar2,in_stack_ffffffffffffffd8);
    uVar3 = SharpYuvGammaToLinear((uint16_t)(v >> 0x10),iVar2,in_stack_ffffffffffffffd8);
    uVar4 = SharpYuvGammaToLinear((uint16_t)(v >> 0x10),iVar2,in_stack_ffffffffffffffd8);
    RGBToGray((ulong)in_stack_ffffffffffffffd8,(ulong)uVar3,(ulong)uVar4);
    uVar1 = SharpYuvLinearToGamma(v,iVar2,in_stack_ffffffffffffffd8);
    *(uint16_t *)(in_RSI + (long)iVar2 * 2) = uVar1;
    iVar2 = iVar2 + 1;
  } while (iVar2 < in_EDX);
  return;
}

Assistant:

static WEBP_INLINE void UpdateW(const fixed_y_t* src, fixed_y_t* dst, int w,
                                int rgb_bit_depth,
                                SharpYuvTransferFunctionType transfer_type) {
  const int bit_depth = rgb_bit_depth + GetPrecisionShift(rgb_bit_depth);
  int i = 0;
  do {
    const uint32_t R =
        SharpYuvGammaToLinear(src[0 * w + i], bit_depth, transfer_type);
    const uint32_t G =
        SharpYuvGammaToLinear(src[1 * w + i], bit_depth, transfer_type);
    const uint32_t B =
        SharpYuvGammaToLinear(src[2 * w + i], bit_depth, transfer_type);
    const uint32_t Y = RGBToGray(R, G, B);
    dst[i] = (fixed_y_t)SharpYuvLinearToGamma(Y, bit_depth, transfer_type);
  } while (++i < w);
}